

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-ir.cc
# Opt level: O0

Result __thiscall
wabt::anon_unknown_15::BinaryReaderIR::TopLabelExpr
          (BinaryReaderIR *this,LabelNode **label,Expr **expr)

{
  bool bVar1;
  Result result;
  reference pvVar2;
  LabelNode *local_38;
  LabelNode *parent_label;
  Expr **local_28;
  Expr **expr_local;
  LabelNode **label_local;
  BinaryReaderIR *this_local;
  
  local_28 = expr;
  expr_local = (Expr **)label;
  label_local = (LabelNode **)this;
  parent_label._4_4_ = TopLabel(this,label);
  bVar1 = Failed(parent_label._4_4_);
  if (bVar1) {
    Result::Result((Result *)((long)&this_local + 4),Error);
  }
  else {
    result = GetLabelAt(this,&local_38,1);
    bVar1 = Failed(result);
    if (bVar1) {
      Result::Result((Result *)((long)&this_local + 4),Error);
    }
    else {
      pvVar2 = intrusive_list<wabt::Expr>::back(local_38->exprs);
      *local_28 = pvVar2;
      Result::Result((Result *)((long)&this_local + 4),Ok);
    }
  }
  return (Result)this_local._4_4_;
}

Assistant:

Result BinaryReaderIR::TopLabelExpr(LabelNode** label, Expr** expr) {
  CHECK_RESULT(TopLabel(label));
  LabelNode* parent_label;
  CHECK_RESULT(GetLabelAt(&parent_label, 1));
  *expr = &parent_label->exprs->back();
  return Result::Ok;
}